

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseConstList(WastParser *this,ConstVector *consts)

{
  pointer *ppCVar1;
  iterator __position;
  bool bVar2;
  Result RVar3;
  Token local_e0;
  undefined1 auStack_90 [8];
  Const const_;
  
  bVar2 = PeekMatchLpar(this,Const);
  if (bVar2) {
    do {
      Consume(&local_e0,this);
      Token::~Token(&local_e0);
      const_.field_2._8_8_ = 0;
      Const::Const((Const *)auStack_90,0,(undefined1 *)((long)&const_.field_2 + 8));
      RVar3 = ParseConst(this,(Const *)auStack_90);
      if ((RVar3.enum_ == Error) || (RVar3 = Expect(this,Rpar), RVar3.enum_ == Error)) {
        return (Result)Error;
      }
      __position._M_current =
           (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::Const,std::allocator<wabt::Const>>::_M_realloc_insert<wabt::Const_const&>
                  ((vector<wabt::Const,std::allocator<wabt::Const>> *)consts,__position,
                   (Const *)auStack_90);
      }
      else {
        *(uint64_t *)((long)&(__position._M_current)->field_2 + 8) = const_.field_2.u64;
        *(undefined8 *)&(__position._M_current)->type = const_.loc.field_1._8_8_;
        ((__position._M_current)->field_2).u64 = const_._32_8_;
        ((__position._M_current)->loc).field_1.field_1.offset = const_.loc.filename.size_;
        ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
        ((long)&((__position._M_current)->loc).field_1 + 8))->offset =
             (size_t)const_.loc.field_1.field_1.offset;
        ((__position._M_current)->loc).filename.data_ = (char *)auStack_90;
        ((__position._M_current)->loc).filename.size_ = (size_type)const_.loc.filename.data_;
        ppCVar1 = &(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      bVar2 = PeekMatchLpar(this,Const);
    } while (bVar2);
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseConstList(ConstVector* consts) {
  WABT_TRACE(ParseConstList);
  while (PeekMatchLpar(TokenType::Const)) {
    Consume();
    Const const_;
    CHECK_RESULT(ParseConst(&const_));
    EXPECT(Rpar);
    consts->push_back(const_);
  }

  return Result::Ok;
}